

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void Convert16To8Row_C(uint16_t *src_y,uint8_t *dst_y,int scale,int width)

{
  ulong uVar1;
  uint8_t uVar2;
  
  if (0 < width) {
    uVar1 = 0;
    do {
      uVar2 = (uint8_t)((uint)src_y[uVar1] * scale >> 0x10);
      if (0xfe < (int)((uint)src_y[uVar1] * scale) >> 0x10) {
        uVar2 = 0xff;
      }
      dst_y[uVar1] = uVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)width != uVar1);
  }
  return;
}

Assistant:

void Convert16To8Row_C(const uint16_t* src_y,
                       uint8_t* dst_y,
                       int scale,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_y[x] = clamp255((src_y[x] * scale) >> 16);
  }
}